

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

void * If_ManDeriveGiaFromCells(void *pGia)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Ifn_Ntk_t *p;
  Gia_Man_t *p_00;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Gia_Obj_t *pObj;
  int *piVar8;
  word *pConfigData;
  Gia_Man_t *pGVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  
  if (*(long *)((long)pGia + 0x138) == 0) {
    __assert_fail("p->vConfigs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x344,"void *If_ManDeriveGiaFromCells(void *)");
  }
  if (*(char **)((long)pGia + 0x140) == (char *)0x0) {
    __assert_fail("p->pCellStr != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x345,"void *If_ManDeriveGiaFromCells(void *)");
  }
  if (*(long *)((long)pGia + 0x108) == 0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x346,"void *If_ManDeriveGiaFromCells(void *)");
  }
  p = Ifn_NtkParse(*(char **)((long)pGia + 0x140));
  Ifn_Prepare(p,(word *)0x0,p->nInps);
  iVar2 = Vec_IntEntry(*(Vec_Int_t **)((long)pGia + 0x138),1);
  p_00 = Gia_ManStart((*(int *)((long)pGia + 0x18) * 6) / 5 + 100);
  pcVar6 = Abc_UtilStrsav(*pGia);
  p_00->pName = pcVar6;
  pcVar6 = Abc_UtilStrsav(*(char **)((long)pGia + 8));
  p_00->pSpec = pcVar6;
  Gia_ManFillValue((Gia_Man_t *)pGia);
  *(undefined4 *)(*(long *)((long)pGia + 0x20) + 8) = 0;
  for (iVar12 = 0; iVar12 < *(int *)(*(long *)((long)pGia + 0x40) + 4); iVar12 = iVar12 + 1) {
    pGVar7 = Gia_ManCi((Gia_Man_t *)pGia,iVar12);
    if (pGVar7 == (Gia_Obj_t *)0x0) break;
    uVar3 = Gia_ManAppendCi(p_00);
    pGVar7->Value = uVar3;
  }
  p_01 = Vec_IntAlloc(0x10);
  p_02 = Vec_IntAlloc(0x10000);
  Gia_ManHashStart(p_00);
  iVar12 = 0;
  for (iVar10 = 0; iVar10 < *(int *)((long)pGia + 0x18); iVar10 = iVar10 + 1) {
    pGVar7 = Gia_ManObj((Gia_Man_t *)pGia,iVar10);
    if (pGVar7 == (Gia_Obj_t *)0x0) break;
    uVar3 = (uint)*(undefined8 *)pGVar7;
    if ((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) {
      if (((uVar3 & 0x1fffffff) == 0x1fffffff) ||
         ((uVar3 & 0x1fffffff) != ((uint)((ulong)*(undefined8 *)pGVar7 >> 0x20) & 0x1fffffff))) {
        iVar4 = Vec_IntEntry(*(Vec_Int_t **)((long)pGia + 0x108),iVar10);
        if (iVar4 == 0) goto LAB_00398223;
        p_01->nSize = 0;
        lVar13 = 0;
        while( true ) {
          pVVar1 = *(Vec_Int_t **)((long)pGia + 0x108);
          iVar4 = Vec_IntEntry(pVVar1,iVar10);
          iVar4 = Vec_IntEntry(pVVar1,iVar4);
          if (iVar4 <= lVar13) break;
          pVVar1 = *(Vec_Int_t **)((long)pGia + 0x108);
          iVar4 = Vec_IntEntry(pVVar1,iVar10);
          piVar8 = Vec_IntEntryP(pVVar1,iVar4);
          pGVar7 = Gia_ManObj((Gia_Man_t *)pGia,piVar8[lVar13 + 1]);
          Vec_IntPush(p_01,pGVar7->Value);
          lVar13 = lVar13 + 1;
        }
        iVar4 = iVar12 + 1;
        pConfigData = (word *)Vec_IntEntryP(*(Vec_Int_t **)((long)pGia + 0x138),iVar12 * iVar2 + 2);
        uVar3 = If_ManSatDeriveGiaFromBits(p_00,p,pConfigData,p_01,p_02);
        pGVar7 = Gia_ManObj((Gia_Man_t *)pGia,iVar10);
      }
      else {
        uVar3 = Gia_ObjFanin0Copy(pGVar7);
        pObj = Gia_ManAppendObj(p_00);
        iVar4 = Abc_Lit2Var(uVar3);
        if (p_00->nObjs <= iVar4) {
          __assert_fail("iLit >= 0 && Abc_Lit2Var(iLit) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x30b,"int Gia_ManAppendBuf(Gia_Man_t *, int)");
        }
        iVar4 = Gia_ObjId(p_00,pObj);
        iVar5 = Abc_Lit2Var(uVar3);
        uVar11 = (ulong)(iVar4 - iVar5 & 0x1fffffff);
        *(ulong *)pObj =
             (ulong)((uVar3 & 1) << 0x1d) |
             (ulong)(uVar3 & 1) << 0x3d | *(ulong *)pObj & 0xc0000000c0000000 | uVar11 << 0x20 |
             uVar11;
        p_00->nBufs = p_00->nBufs + 1;
        iVar4 = Gia_ObjId(p_00,pObj);
        uVar3 = iVar4 * 2;
        iVar4 = iVar12;
      }
      pGVar7->Value = uVar3;
      iVar12 = iVar4;
    }
LAB_00398223:
  }
  iVar10 = Vec_IntEntry(*(Vec_Int_t **)((long)pGia + 0x138),0);
  if (iVar10 != iVar12) {
    __assert_fail("Vec_IntEntry(p->vConfigs, 0) == Count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x36e,"void *If_ManDeriveGiaFromCells(void *)");
  }
  if (*(int *)(*(long *)((long)pGia + 0x138) + 4) != iVar12 * iVar2 + 2) {
    __assert_fail("Vec_IntSize(p->vConfigs) == 2 + nConfigInts * Count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x36f,"void *If_ManDeriveGiaFromCells(void *)");
  }
  for (iVar2 = 0; iVar2 < *(int *)(*(long *)((long)pGia + 0x48) + 4); iVar2 = iVar2 + 1) {
    pGVar7 = Gia_ManCo((Gia_Man_t *)pGia,iVar2);
    if (pGVar7 == (Gia_Obj_t *)0x0) break;
    iVar12 = Gia_ObjFanin0Copy(pGVar7);
    uVar3 = Gia_ManAppendCo(p_00,iVar12);
    pGVar7->Value = uVar3;
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,*(int *)((long)pGia + 0x10));
  Vec_IntFree(p_01);
  Vec_IntFree(p_02);
  free(p);
  pGVar9 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar9;
}

Assistant:

void * If_ManDeriveGiaFromCells( void * pGia )
{
    Gia_Man_t * p = (Gia_Man_t *)pGia;
    Gia_Man_t * pNew, * pTemp;
    Vec_Int_t * vCover, * vLeaves;
    Ifn_Ntk_t * pNtkCell;
    Gia_Obj_t * pObj; 
    word * pConfigData;
    //word * pTruth;
    int k, i, iLut, iVar;
    int nConfigInts, Count = 0;
    assert( p->vConfigs != NULL );
    assert( p->pCellStr != NULL );
    assert( Gia_ManHasMapping(p) );
    // derive cell network
    pNtkCell = Ifn_NtkParse( p->pCellStr );
    Ifn_Prepare( pNtkCell, NULL, pNtkCell->nInps );
    nConfigInts = Vec_IntEntry( p->vConfigs, 1 );
    // create new manager
    pNew = Gia_ManStart( 6*Gia_ManObjNum(p)/5 + 100 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // map primary inputs
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // iterate through nodes used in the mapping
    vLeaves = Vec_IntAlloc( 16 );
    vCover  = Vec_IntAlloc( 1 << 16 );
    Gia_ManHashStart( pNew );
    //Gia_ObjComputeTruthTableStart( p, Gia_ManLutSizeMax(p) );
    Gia_ManForEachAnd( p, pObj, iLut )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
            continue;
        }
        if ( !Gia_ObjIsLut(p, iLut) )
            continue;
        // collect leaves
        //Vec_IntClear( vLeaves );
        //Gia_LutForEachFanin( p, iLut, iVar, k )
        //    Vec_IntPush( vLeaves, iVar );
        //pTruth = Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, iLut), vLeaves );
        // collect incoming literals
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( p, iLut, iVar, k )
            Vec_IntPush( vLeaves, Gia_ManObj(p, iVar)->Value );
        pConfigData = (word *)Vec_IntEntryP( p->vConfigs, 2 + nConfigInts * Count++ );
        Gia_ManObj(p, iLut)->Value = If_ManSatDeriveGiaFromBits( pNew, pNtkCell, pConfigData, vLeaves, vCover );
    }
    assert( Vec_IntEntry(p->vConfigs, 0) == Count );
    assert( Vec_IntSize(p->vConfigs) == 2 + nConfigInts * Count );
    //Gia_ObjComputeTruthTableStop( p );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vCover );
    ABC_FREE( pNtkCell );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;

}